

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_nls.c
# Opt level: O2

int mriStep_NlsResidual(N_Vector zcor,N_Vector r,void *arkode_mem)

{
  int iVar1;
  int iVar2;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  N_Vector X [3];
  realtype local_28 [3];
  
  iVar1 = mriStep_AccessStepMem(arkode_mem,"mriStep_NlsResidual",&ark_mem,&step_mem);
  if (iVar1 == 0) {
    N_VLinearSum(1.0,step_mem->zpred,1.0,zcor,ark_mem->ycur);
    iVar1 = (*step_mem->nls_fsi)
                      (ark_mem->tcur,ark_mem->ycur,
                       step_mem->Fsi[step_mem->stage_map[step_mem->istage]],ark_mem->user_data);
    step_mem->nfsi = step_mem->nfsi + 1;
    if (iVar1 < 0) {
      iVar1 = -8;
    }
    else if (iVar1 == 0) {
      local_28[0] = 1.0;
      local_28[1] = -1.0;
      X[1] = step_mem->sdata;
      local_28[2] = -step_mem->gamma;
      X[2] = step_mem->Fsi[step_mem->stage_map[step_mem->istage]];
      X[0] = zcor;
      iVar2 = N_VLinearCombination(3,local_28,X,r);
      iVar1 = -0x1c;
      if (iVar2 == 0) {
        iVar1 = 0;
      }
    }
    else {
      iVar1 = 9;
    }
  }
  return iVar1;
}

Assistant:

int mriStep_NlsResidual(N_Vector zcor, N_Vector r, void* arkode_mem)
{
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  int retval;
  realtype c[3];
  N_Vector X[3];

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(arkode_mem, "mriStep_NlsResidual",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* update 'ycur' value as stored predictor + current corrector */
  N_VLinearSum(ONE, step_mem->zpred, ONE, zcor, ark_mem->ycur);

  /* compute slow implicit RHS and save for later */
  retval = step_mem->nls_fsi(ark_mem->tcur, ark_mem->ycur,
                             step_mem->Fsi[step_mem->stage_map[step_mem->istage]],
                             ark_mem->user_data);
  step_mem->nfsi++;
  if (retval < 0) return(ARK_RHSFUNC_FAIL);
  if (retval > 0) return(RHSFUNC_RECVR);

  /* compute residual: zcor - gamma*Fsi - sdata */
  c[0] = ONE;
  X[0] = zcor;
  c[1] = -ONE;
  X[1] = step_mem->sdata;
  c[2] = -step_mem->gamma;
  X[2] = step_mem->Fsi[step_mem->stage_map[step_mem->istage]];
  retval = N_VLinearCombination(3, c, X, r);
  if (retval != 0)  return(ARK_VECTOROP_ERR);
  return(ARK_SUCCESS);
}